

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rectangle.cpp
# Opt level: O0

Vector3 __thiscall pm::Rectangle::sample(Rectangle *this)

{
  long in_RSI;
  Vector3 VVar1;
  pm local_44 [12];
  pm local_38 [12];
  Vector3 local_2c;
  float local_20;
  float local_1c;
  Vector2 sp;
  Rectangle *this_local;
  
  SamplerState::sampleUnitSquare((SamplerState *)&local_20);
  operator*(local_38,local_20,(Vector3 *)(in_RSI + 0x24));
  Vector3::operator+(&local_2c,(Vector3 *)(in_RSI + 0x18));
  operator*(local_44,local_1c,(Vector3 *)(in_RSI + 0x30));
  VVar1 = Vector3::operator+((Vector3 *)this,&local_2c);
  return VVar1;
}

Assistant:

Vector3 Rectangle::sample(void) const
{
	Vector2 sp = samplerState_.sampleUnitSquare();
	return Vector3(point_ + sp.x * a_ + sp.y * b_);
}